

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_roundtrip_test.cxx
# Opt level: O1

void test_linear_roundtrip<cryptox::symmetric_algorithm<&EVP_bf_cfb64>>(size_t buffer_size)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  value_type_conflict1 *__val;
  long lVar1;
  uint8_t input [1];
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>_> endec;
  allocator_type local_c9;
  vector<unsigned_char,std::allocator<unsigned_char>> local_c8;
  undefined7 uStack_c7;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>_> local_b0;
  
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>_>::endec_pair_tester
            (&local_b0);
  __first._M_current = (uchar *)operator_new(0x1000);
  lVar1 = 0;
  memset(__first._M_current,0,0x1000);
  do {
    RAND_bytes((uchar *)&local_c8,1);
    *(vector<unsigned_char,std::allocator<unsigned_char>> *)(__first._M_current + lVar1) = local_c8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1000);
  lVar1 = 0;
  do {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (&local_c8,__first,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + lVar1),&local_c9);
    cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>>::
    check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>> *)&local_b0,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    if ((void *)CONCAT71(uStack_c7,local_c8) != (void *)0x0) {
      operator_delete((void *)CONCAT71(uStack_c7,local_c8));
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1001);
  operator_delete(__first._M_current);
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)
                      local_b0.decryptor.
                      super_basic_endec<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
                      .
                      super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
                      ._context);
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)
                      local_b0.encryptor.
                      super_basic_endec<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
                      .
                      super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
                      ._context);
  if (local_b0.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void test_linear_roundtrip(const size_t buffer_size = 4096) {
	cryptox::tests::endec_pair_tester<Algorithm> endec;

	typedef std::vector<std::uint8_t> buffer_type;

	using cryptox::detail::make_random_vector;
	const buffer_type master = make_random_vector(buffer_size);
	for (int i=0; i<=master.size(); ++i) {
		endec.check_roundtrip(
			buffer_type(master.begin(), master.begin() + i)
		);
	}
}